

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O3

void * index_tree_locate(index_tree *tree,lzma_vli target)

{
  index_tree *piVar1;
  index_tree_node *in_RDX;
  
  if ((target != 0) && (*(long *)target != 0)) {
    __assert_fail("tree->leftmost == NULL || tree->leftmost->uncompressed_base == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                  ,0x141,"void *index_tree_locate(const index_tree *, lzma_vli)");
  }
  piVar1 = (index_tree *)0x0;
  for (; tree != (index_tree *)0x0;
      tree = *(index_tree **)(&tree->count + (ulong)(tree->root <= in_RDX) * 2)) {
    if (tree->root <= in_RDX) {
      piVar1 = tree;
    }
  }
  return piVar1;
}

Assistant:

static void *
index_tree_locate(const index_tree *tree, lzma_vli target)
{
	const index_tree_node *result = NULL;
	const index_tree_node *node = tree->root;

	assert(tree->leftmost == NULL
			|| tree->leftmost->uncompressed_base == 0);

	// Consecutive nodes may have the same uncompressed_base.
	// We must pick the rightmost one.
	while (node != NULL) {
		if (node->uncompressed_base > target) {
			node = node->left;
		} else {
			result = node;
			node = node->right;
		}
	}

	return (void *)(result);
}